

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::CompactReporter::testRunEnded(CompactReporter *this,TestRunStats *_testRunStats)

{
  ostream *this_00;
  TestRunStats *_testRunStats_local;
  CompactReporter *this_local;
  
  anon_unknown_1::printTotals
            ((this->super_StreamingReporterBase<Catch::CompactReporter>).stream,
             &_testRunStats->totals);
  this_00 = std::operator<<((this->super_StreamingReporterBase<Catch::CompactReporter>).stream,'\n')
  ;
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  StreamingReporterBase<Catch::CompactReporter>::testRunEnded
            (&this->super_StreamingReporterBase<Catch::CompactReporter>,_testRunStats);
  return;
}

Assistant:

void CompactReporter::testRunEnded( TestRunStats const& _testRunStats ) {
            printTotals( stream, _testRunStats.totals );
            stream << '\n' << std::endl;
            StreamingReporterBase::testRunEnded( _testRunStats );
        }